

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffect.cpp
# Opt level: O0

void Rml::FontEffect::FillColorValuesFromAlpha(byte *destination,Vector2i dimensions,int stride)

{
  byte bVar1;
  int iVar2;
  int iStack_24;
  byte alpha;
  int i;
  int x;
  int y;
  int stride_local;
  byte *destination_local;
  Vector2i dimensions_local;
  
  for (i = 0; destination_local._4_4_ = dimensions.y, i < destination_local._4_4_; i = i + 1) {
    for (iStack_24 = 0; destination_local._0_4_ = dimensions.x, iStack_24 < (int)destination_local;
        iStack_24 = iStack_24 + 1) {
      iVar2 = i * stride + iStack_24 * 4;
      bVar1 = destination[iVar2 + 3];
      destination[iVar2 + 2] = bVar1;
      destination[iVar2 + 1] = bVar1;
      destination[iVar2] = bVar1;
    }
  }
  return;
}

Assistant:

void FontEffect::FillColorValuesFromAlpha(byte* destination, Vector2i dimensions, int stride)
{
	for (int y = 0; y < dimensions.y; ++y)
	{
		for (int x = 0; x < dimensions.x; ++x)
		{
			const int i = y * stride + x * 4;
			const byte alpha = destination[i + 3];
			destination[i + 0] = destination[i + 1] = destination[i + 2] = alpha;
		}
	}
}